

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitNumberOf(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                *this,NumberOfExpr e)

{
  Expr e_00;
  Parameters prm;
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ExprBase __x;
  EExpr *in_RDI;
  int i_1;
  int i;
  EExpr valexpr;
  VarArray va;
  EExpr *in_stack_fffffffffffffc78;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffc80;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
  *this_00;
  undefined4 in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc8c;
  ExprBase in_stack_fffffffffffffc90;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffca8;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *this_01;
  undefined4 in_stack_fffffffffffffcb0;
  int in_stack_fffffffffffffcb4;
  ExprBase in_stack_fffffffffffffcb8;
  EExpr *this_02;
  CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
  local_2f8;
  ExprBase local_2b0;
  int local_2a0;
  int local_29c;
  int local_298;
  undefined4 local_294;
  double local_290;
  EnvKeeper local_228;
  int local_218;
  int local_214;
  ExprBase local_210;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_fffffffffffffe58;
  ExprBase in_stack_fffffffffffffe60;
  
  this_02 = in_RDI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x61bf26);
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              *)0x61bf33);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)
             CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
             (size_type)in_stack_fffffffffffffca8);
  __x.impl_ = (Impl *)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                      ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                             *)in_stack_fffffffffffffc78,0);
  local_210.impl_ = __x.impl_;
  BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
  BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffc90.impl_,
             (type_conflict)((ulong)in_stack_fffffffffffffc80 >> 0x20));
  e_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffc8c;
  e_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffc88;
  Convert2EExpr(in_stack_fffffffffffffc80,e_00);
  bVar1 = AlgebraicExpression<mp::QuadAndLinTerms>::is_constant
                    ((AlgebraicExpression<mp::QuadAndLinTerms> *)0x61bfb4);
  if (bVar1) {
    local_214 = 1;
    while( true ) {
      iVar3 = local_214;
      iVar2 = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                          *)0x61bfe0);
      if (iVar2 <= iVar3) break;
      in_stack_fffffffffffffcb8.impl_ =
           (Impl *)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                   ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                          *)in_stack_fffffffffffffc78,0);
      local_228.env_ = (Env *)in_stack_fffffffffffffcb8.impl_;
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffc90.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      in_stack_fffffffffffffcb4 =
           Convert2Var(in_stack_fffffffffffffe58,(Expr)in_stack_fffffffffffffe60.impl_);
      local_218 = in_stack_fffffffffffffcb4;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                 (value_type *)in_stack_fffffffffffffc78);
      local_214 = local_214 + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_02,
               (vector<int,_std::allocator<int>_> *)__x.impl_);
    local_290 = AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
                          ((AlgebraicExpression<mp::QuadAndLinTerms> *)&stack0xfffffffffffffe00);
    this_01 = (ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
               *)&stack0xfffffffffffffd90;
    prm._M_elems[0]._4_4_ = iVar2;
    prm._M_elems[0]._0_4_ = iVar3;
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
    ::CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
                *)in_stack_fffffffffffffcb8.impl_,
               (Arguments *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),prm);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<double,1ul>,mp::NumericFunctionalConstraintTraits,mp::NumberofConstId>>
              (this_01,(CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
                        *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0));
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
    ::~CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<double,_1UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofConstId>
                *)in_stack_fffffffffffffc80);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90.impl_);
  }
  else {
    iVar3 = Convert2Var(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
    local_298 = iVar3;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
               (value_type *)in_stack_fffffffffffffc78);
    local_29c = 1;
    while( true ) {
      iVar2 = local_29c;
      iVar4 = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                          *)0x61c1db);
      if (iVar4 <= iVar2) break;
      in_stack_fffffffffffffc90.impl_ =
           (Impl *)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                   ::arg((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                          *)in_stack_fffffffffffffc78,0);
      local_2b0.impl_ = in_stack_fffffffffffffc90.impl_;
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88),
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)in_stack_fffffffffffffc90.impl_,
                 (type_conflict)((ulong)in_stack_fffffffffffffc80 >> 0x20));
      in_stack_fffffffffffffc8c =
           Convert2Var(in_stack_fffffffffffffe58,(Expr)in_stack_fffffffffffffe60.impl_);
      local_2a0 = in_stack_fffffffffffffc8c;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc80,
                 (value_type *)in_stack_fffffffffffffc78);
      local_29c = local_29c + 1;
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)this_02,
               (vector<int,_std::allocator<int>_> *)__x.impl_);
    this_00 = &local_2f8;
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
    ::CustomFunctionalConstraint
              ((CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
                *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0),
               (Arguments *)in_stack_fffffffffffffca8);
    ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>,mp::BasicProblem<mp::BasicProblemParams<int>>,mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>>
    ::
    AssignResult2Args<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::NumberofVarId>>
              (in_stack_fffffffffffffca8,
               (CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
                *)CONCAT44(iVar3,iVar4));
    CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::NumberofVarId>
    ::~CustomFunctionalConstraint(this_00);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90.impl_);
  }
  local_294 = 1;
  EExpr::~EExpr((EExpr *)0x61c323);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc90.impl_);
  return in_RDI;
}

Assistant:

EExpr VisitNumberOf(typename BaseExprVisitor::NumberOfExpr e) {
    VarArray va;
    va.reserve(e.num_args());
    EExpr valexpr = Convert2EExpr(e.arg(0));
    if (valexpr.is_constant()) {
      for (int i=1; i<e.num_args(); ++i)
        va.push_back(Convert2Var(e.arg(i)));
      return AssignResult2Args( NumberofConstConstraint{
                                  va, { valexpr.constant_term() }
                                } );
    } else {
      va.push_back(Convert2Var(std::move(valexpr)));
      for (int i=1; i<e.num_args(); ++i)
        va.push_back(Convert2Var(e.arg(i)));
      return AssignResult2Args( NumberofVarConstraint{ va } );
    }
  }